

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O0

FT_Error cff_get_glyph_name(CFF_Face face,FT_UInt glyph_index,FT_Pointer buffer,FT_UInt buffer_max)

{
  CFF_Font_conflict font_00;
  FT_Error FVar1;
  FT_Module module;
  long *plVar2;
  FT_String *src;
  FT_Service_GlyphDict service;
  FT_Module sfnt_module;
  FT_Library library;
  FT_Error error;
  FT_UShort sid;
  FT_String *gname;
  CFF_Font_conflict font;
  FT_UInt buffer_max_local;
  FT_Pointer buffer_local;
  FT_UInt glyph_index_local;
  CFF_Face face_local;
  
  font_00 = (CFF_Font_conflict)(face->extra).data;
  if (font_00->version_major == '\x02') {
    module = FT_Get_Module((((face->root).driver)->root).library,"sfnt");
    plVar2 = (long *)ft_module_get_service(module,"glyph-dict",'\0');
    if ((plVar2 != (long *)0x0) && (*plVar2 != 0)) {
      FVar1 = (*(code *)*plVar2)(face,glyph_index,buffer,buffer_max);
      return FVar1;
    }
    library._0_4_ = 0xb;
  }
  else if (font_00->psnames == (FT_Service_PsCMaps)0x0) {
    library._0_4_ = 0xb;
  }
  else {
    src = cff_index_get_sid_string(font_00,(uint)(font_00->charset).sids[glyph_index]);
    if (src != (FT_String *)0x0) {
      ft_mem_strcpyn((char *)buffer,src,(ulong)buffer_max);
    }
    library._0_4_ = 0;
  }
  return (FT_Error)library;
}

Assistant:

static FT_Error
  cff_get_glyph_name( CFF_Face    face,
                      FT_UInt     glyph_index,
                      FT_Pointer  buffer,
                      FT_UInt     buffer_max )
  {
    CFF_Font    font   = (CFF_Font)face->extra.data;
    FT_String*  gname;
    FT_UShort   sid;
    FT_Error    error;


    /* CFF2 table does not have glyph names; */
    /* we need to use `post' table method    */
    if ( font->version_major == 2 )
    {
      FT_Library            library     = FT_FACE_LIBRARY( face );
      FT_Module             sfnt_module = FT_Get_Module( library, "sfnt" );
      FT_Service_GlyphDict  service     =
        (FT_Service_GlyphDict)ft_module_get_service(
                                 sfnt_module,
                                 FT_SERVICE_ID_GLYPH_DICT,
                                 0 );


      if ( service && service->get_name )
        return service->get_name( FT_FACE( face ),
                                  glyph_index,
                                  buffer,
                                  buffer_max );
      else
      {
        FT_ERROR(( "cff_get_glyph_name:"
                   " cannot get glyph name from a CFF2 font\n"
                   "                   "
                   " without the `PSNames' module\n" ));
        error = FT_THROW( Missing_Module );
        goto Exit;
      }
    }

    if ( !font->psnames )
    {
      FT_ERROR(( "cff_get_glyph_name:"
                 " cannot get glyph name from CFF & CEF fonts\n"
                 "                   "
                 " without the `PSNames' module\n" ));
      error = FT_THROW( Missing_Module );
      goto Exit;
    }

    /* first, locate the sid in the charset table */
    sid = font->charset.sids[glyph_index];

    /* now, lookup the name itself */
    gname = cff_index_get_sid_string( font, sid );

    if ( gname )
      FT_STRCPYN( buffer, gname, buffer_max );

    error = FT_Err_Ok;

  Exit:
    return error;
  }